

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSat.c
# Opt level: O1

void Cbs_ManAssign(Cbs_Man_t *p,Gia_Obj_t *pObj,int Level,Gia_Obj_t *pRes0,Gia_Obj_t *pRes1)

{
  uint uVar1;
  uint uVar2;
  Gia_Obj_t **ppGVar3;
  int iVar4;
  int Entry;
  Gia_Obj_t *pGVar5;
  
  pGVar5 = (Gia_Obj_t *)((ulong)pObj & 0xfffffffffffffffe);
  uVar2 = (uint)*(ulong *)pGVar5;
  if (((~uVar2 & 0x9fffffff) != 0) && ((int)uVar2 < 0 || (~uVar2 & 0x1fffffff) == 0)) {
    __assert_fail("Gia_ObjIsCand(pObjR)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSat.c"
                  ,0x1fe,
                  "void Cbs_ManAssign(Cbs_Man_t *, Gia_Obj_t *, int, Gia_Obj_t *, Gia_Obj_t *)");
  }
  if ((uVar2 >> 0x1e & 1) != 0) {
    __assert_fail("!Cbs_VarIsAssigned(pObjR)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSat.c"
                  ,0x1ff,
                  "void Cbs_ManAssign(Cbs_Man_t *, Gia_Obj_t *, int, Gia_Obj_t *, Gia_Obj_t *)");
  }
  *(ulong *)pGVar5 =
       (*(ulong *)pGVar5 & 0xbfffffffbfffffff | (ulong)((uint)pObj & 1) << 0x3e) ^
       0x4000000040000000;
  if (pGVar5->Value == 0xffffffff) {
    uVar2 = (p->pProp).iTail;
    pGVar5->Value = uVar2;
    uVar1 = (p->pProp).nSize;
    if (uVar2 == uVar1) {
      (p->pProp).nSize = uVar1 * 2;
      ppGVar3 = (p->pProp).pData;
      if (ppGVar3 == (Gia_Obj_t **)0x0) {
        ppGVar3 = (Gia_Obj_t **)malloc((long)(int)uVar1 << 4);
      }
      else {
        ppGVar3 = (Gia_Obj_t **)realloc(ppGVar3,(long)(int)uVar1 << 4);
      }
      (p->pProp).pData = ppGVar3;
    }
    iVar4 = (p->pProp).iTail;
    (p->pProp).iTail = iVar4 + 1;
    (p->pProp).pData[iVar4] = pGVar5;
    Vec_IntPush(p->vLevReas,Level);
    iVar4 = 0;
    Entry = 0;
    if (pRes0 != (Gia_Obj_t *)0x0) {
      Entry = (int)((ulong)((long)pRes0 - (long)pGVar5) >> 2) * -0x55555555;
    }
    Vec_IntPush(p->vLevReas,Entry);
    if (pRes1 != (Gia_Obj_t *)0x0) {
      iVar4 = (int)((ulong)((long)pRes1 - (long)pGVar5) >> 2) * -0x55555555;
    }
    Vec_IntPush(p->vLevReas,iVar4);
    if (p->vLevReas->nSize == (p->pProp).iTail * 3) {
      return;
    }
    __assert_fail("Vec_IntSize(p->vLevReas) == 3 * p->pProp.iTail",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSat.c"
                  ,0x208,
                  "void Cbs_ManAssign(Cbs_Man_t *, Gia_Obj_t *, int, Gia_Obj_t *, Gia_Obj_t *)");
  }
  __assert_fail("pObjR->Value == ~0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSat.c"
                ,0x202,"void Cbs_ManAssign(Cbs_Man_t *, Gia_Obj_t *, int, Gia_Obj_t *, Gia_Obj_t *)"
               );
}

Assistant:

static inline void Cbs_ManAssign( Cbs_Man_t * p, Gia_Obj_t * pObj, int Level, Gia_Obj_t * pRes0, Gia_Obj_t * pRes1 )
{
    Gia_Obj_t * pObjR = Gia_Regular(pObj);
    assert( Gia_ObjIsCand(pObjR) );
    assert( !Cbs_VarIsAssigned(pObjR) );
    Cbs_VarAssign( pObjR );
    Cbs_VarSetValue( pObjR, !Gia_IsComplement(pObj) );
    assert( pObjR->Value == ~0 );
    pObjR->Value = p->pProp.iTail;
    Cbs_QuePush( &p->pProp, pObjR );
    Vec_IntPush( p->vLevReas, Level );
    Vec_IntPush( p->vLevReas, pRes0 ? pRes0-pObjR : 0 );
    Vec_IntPush( p->vLevReas, pRes1 ? pRes1-pObjR : 0 );
    assert( Vec_IntSize(p->vLevReas) == 3 * p->pProp.iTail );
//    s_Counter++;
//    s_Counter = Abc_MaxIntInt( s_Counter, Vec_IntSize(p->vLevReas)/3 );
}